

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O0

int stbi_is_hdr_from_file(FILE *f)

{
  int iVar1;
  stbi__context s;
  FILE *in_stack_ffffffffffffff28;
  stbi__context *in_stack_ffffffffffffff30;
  
  stbi__start_file(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
  iVar1 = stbi__hdr_test(in_stack_ffffffffffffff30);
  return iVar1;
}

Assistant:

STBIDEF int      stbi_is_hdr_from_file(FILE *f)
{
   #ifndef STBI_NO_HDR
   stbi__context s;
   stbi__start_file(&s,f);
   return stbi__hdr_test(&s);
   #else
   return 0;
   #endif
}